

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O0

void __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::init_asio
          (endpoint<websocketpp::config::asio::transport_config> *this)

{
  unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *in_RDI;
  io_service_ptr in_stack_00000008;
  endpoint<websocketpp::config::asio::transport_config> *in_stack_00000010;
  unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> service;
  execution_context in_stack_fffffffffffffff0;
  
  operator_new(0x10);
  ::asio::io_context::io_context((io_context *)in_stack_fffffffffffffff0.service_registry_);
  std::unique_ptr<asio::io_context,std::default_delete<asio::io_context>>::
  unique_ptr<std::default_delete<asio::io_context>,void>(in_RDI,(pointer)&stack0xfffffffffffffff0);
  std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::get(in_RDI);
  init_asio(in_stack_00000010,in_stack_00000008);
  std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::release
            ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)0x2b9ee4);
  *(undefined1 *)
   &in_RDI[0x11]._M_t.
    super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
    super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
    super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl = 0;
  std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::~unique_ptr(in_RDI);
  return;
}

Assistant:

void init_asio() {
        // Use a smart pointer until the call is successful and ownership has 
        // successfully been taken. Use unique_ptr when available.
        // TODO: remove the use of auto_ptr when C++98/03 support is no longer
        //       necessary.
#ifdef _WEBSOCKETPP_CPP11_MEMORY_
        lib::unique_ptr<lib::asio::io_service> service(new lib::asio::io_service());
#else
        lib::auto_ptr<lib::asio::io_service> service(new lib::asio::io_service());
#endif
        init_asio( service.get() );
        // If control got this far without an exception, then ownership has successfully been taken
        service.release();
        m_external_io_service = false;
    }